

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

char * Wlc_PrsFindName(char *pStr,char **ppPlace)

{
  bool bVar1;
  int iVar2;
  int local_30;
  int Count;
  int fNotName;
  char *pThis;
  char **ppPlace_local;
  char *pStr_local;
  
  *ppPlace = Wlc_PrsFindName::Buffer;
  _Count = Wlc_PrsFindName::Buffer;
  bVar1 = true;
  local_30 = 0;
  ppPlace_local = (char **)Wlc_PrsSkipSpaces(pStr);
  iVar2 = Wlc_PrsIsChar((char *)ppPlace_local);
  if (iVar2 == 0) {
    pStr_local = (char *)0x0;
  }
  else {
    while ((*(char *)ppPlace_local != '\0' &&
           ((!bVar1 || (iVar2 = Wlc_PrsIsChar((char *)ppPlace_local), iVar2 != 0))))) {
      if (*(char *)ppPlace_local == '\\') {
        local_30 = local_30 + 1;
        bVar1 = false;
      }
      else if (((!bVar1) && (*(char *)ppPlace_local == ' ')) &&
              (local_30 = local_30 + -1, local_30 == 0)) {
        bVar1 = true;
      }
      *_Count = *(char *)ppPlace_local;
      _Count = _Count + 1;
      ppPlace_local = (char **)((long)ppPlace_local + 1);
    }
    *_Count = '\0';
    pStr_local = (char *)ppPlace_local;
  }
  return pStr_local;
}

Assistant:

static inline char * Wlc_PrsFindName( char * pStr, char ** ppPlace )
{
    static char Buffer[WLV_PRS_MAX_LINE];
    char * pThis = *ppPlace = Buffer;
    int fNotName = 1, Count = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( !Wlc_PrsIsChar(pStr) )
        return NULL;
//    while ( Wlc_PrsIsChar(pStr) )
//        *pThis++ = *pStr++;
    while ( *pStr )
    {
        if ( fNotName && !Wlc_PrsIsChar(pStr) )
            break;
        if ( *pStr == '\\' )
        {
            Count++;
            fNotName = 0;
        }
        else if ( !fNotName && *pStr == ' ' )
        {
            Count--;
            if ( !Count )
                fNotName = 1;
        }
        *pThis++ = *pStr++;
    }
    *pThis = 0;
    return pStr;
}